

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::cose::Sign1Message::SetContent
          (Error *__return_storage_ptr__,Sign1Message *this,ByteArray *aContent)

{
  byte *rgb;
  byte *pbVar1;
  _Bool _Var2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  uint8_t emptyContent;
  string local_90;
  undefined1 local_70 [40];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  rgb = (aContent->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pbVar1 = (aContent->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (rgb == pbVar1) {
    emptyContent = '\0';
    _Var2 = COSE_Sign0_SetContent(this->mSign,&emptyContent,0,(cose_errback *)0x0);
    if (_Var2) {
      return __return_storage_ptr__;
    }
    local_48.types_[0] = none_type;
    local_48.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "set COSE SIGN1 message content";
    local_48.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_48.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_48.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_48.parse_funcs_[0] = (parse_func)0x0;
    pcVar3 = "set COSE SIGN1 message content";
    local_48.context_.types_ = local_48.types_;
    while (pcVar4 = pcVar3, pcVar4 != "") {
      pcVar3 = pcVar4 + 1;
      if (*pcVar4 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar4 + 2;
      }
      else if (*pcVar4 == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",&local_48);
      }
    }
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_48;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_90,(v10 *)"set COSE SIGN1 message content",(string_view)ZEXT816(0x1e),args_00)
    ;
    local_70._0_4_ = kUnknown;
    std::__cxx11::string::string((string *)(local_70 + 8),(string *)&local_90);
  }
  else {
    _Var2 = COSE_Sign0_SetContent(this->mSign,rgb,(long)pbVar1 - (long)rgb,(cose_errback *)0x0);
    if (_Var2) {
      return __return_storage_ptr__;
    }
    local_48.types_[0] = none_type;
    local_48.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "set COSE SIGN1 message content";
    local_48.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_48.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_48.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_48.parse_funcs_[0] = (parse_func)0x0;
    pcVar3 = "set COSE SIGN1 message content";
    local_48.context_.types_ = local_48.types_;
    while (pcVar4 = pcVar3, pcVar4 != "") {
      pcVar3 = pcVar4 + 1;
      if (*pcVar4 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar4 + 2;
      }
      else if (*pcVar4 == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",&local_48);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_48;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_90,(v10 *)"set COSE SIGN1 message content",(string_view)ZEXT816(0x1e),args);
    local_70._0_4_ = kUnknown;
    std::__cxx11::string::string((string *)(local_70 + 8),(string *)&local_90);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_70);
  std::__cxx11::string::~string((string *)(local_70 + 8));
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::SetContent(const ByteArray &aContent)
{
    Error error;

    if (!aContent.empty())
    {
        VerifyOrExit(COSE_Sign0_SetContent(mSign, &aContent[0], aContent.size(), nullptr),
                     error = ERROR_UNKNOWN("set COSE SIGN1 message content"));
    }
    else
    {
        uint8_t emptyContent = 0;
        VerifyOrExit(COSE_Sign0_SetContent(mSign, &emptyContent, 0, nullptr),
                     error = ERROR_UNKNOWN("set COSE SIGN1 message content"));
    }

exit:
    return error;
}